

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stop_Freeze_R_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Stop_Freeze_R_PDU::Stop_Freeze_R_PDU(Stop_Freeze_R_PDU *this)

{
  Stop_Freeze_R_PDU *this_local;
  
  Stop_Freeze_PDU::Stop_Freeze_PDU(&this->super_Stop_Freeze_PDU);
  Reliability_Header::Reliability_Header(&this->super_Reliability_Header);
  (this->super_Stop_Freeze_PDU).super_Simulation_Management_Header.super_Header.super_Header6.
  _vptr_Header6 = (_func_int **)&PTR__Stop_Freeze_R_PDU_0032f118;
  (this->super_Reliability_Header)._vptr_Reliability_Header =
       (_func_int **)&PTR__Stop_Freeze_R_PDU_0032f158;
  (this->super_Stop_Freeze_PDU).super_Simulation_Management_Header.super_Header.super_Header6.
  m_ui8PDUType = '6';
  (this->super_Stop_Freeze_PDU).super_Simulation_Management_Header.super_Header.super_Header6.
  m_ui16PDULength = 0x28;
  (this->super_Stop_Freeze_PDU).super_Simulation_Management_Header.super_Header.super_Header6.
  m_ui8ProtocolVersion = '\x06';
  (this->super_Stop_Freeze_PDU).super_Simulation_Management_Header.super_Header.super_Header6.
  m_ui8ProtocolFamily = '\n';
  return;
}

Assistant:

Stop_Freeze_R_PDU::Stop_Freeze_R_PDU()
{
    m_ui8PDUType = Stop_Freeze_R_PDU_Type;
    m_ui16PDULength = STOP_FREEZE_R_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1A_1998;
    m_ui8ProtocolFamily = SimulationManagementwithReliability;
}